

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::SetSections
          (cmDocumentation *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
          *sections)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (sections->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(sections->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    SetSection(this,*(char **)(p_Var1 + 1),*(cmDocumentationSection **)(p_Var1 + 2));
  }
  return;
}

Assistant:

void cmDocumentation::SetSections(
  std::map<std::string, cmDocumentationSection*>& sections)
{
  for (std::map<std::string, cmDocumentationSection*>::const_iterator it =
         sections.begin();
       it != sections.end(); ++it) {
    this->SetSection(it->first.c_str(), it->second);
  }
}